

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_handle.cc
# Opt level: O0

bool __thiscall
absl::cord_internal::CordzHandle::DiagnosticsHandleIsSafeToInspect
          (CordzHandle *this,CordzHandle *handle)

{
  bool bVar1;
  anon_class_1_0_00000001 local_45;
  undefined4 local_44;
  __pointer_type local_40;
  CordzHandle *p;
  MutexLock lock;
  Queue *global_queue;
  bool snapshot_found;
  CordzHandle *handle_local;
  CordzHandle *this_local;
  
  if ((this->is_snapshot_ & 1U) == 0) {
    bVar1 = false;
  }
  else if (handle == (CordzHandle *)0x0) {
    bVar1 = true;
  }
  else if ((handle->is_snapshot_ & 1U) == 0) {
    bVar1 = false;
    lock.mu_ = &anon_unknown_0::GlobalQueue()->mutex;
    MutexLock::MutexLock((MutexLock *)&p,lock.mu_);
    for (local_40 = std::atomic::operator_cast_to_CordzHandle_((atomic *)(lock.mu_ + 1));
        local_40 != (__pointer_type)0x0; local_40 = local_40->dq_prev_) {
      if (local_40 == handle) {
        bVar1 = (bool)(bVar1 ^ 1);
        goto LAB_001e23d0;
      }
      if (local_40 == this) {
        bVar1 = true;
      }
    }
    if (!bVar1) {
      DiagnosticsHandleIsSafeToInspect::anon_class_1_0_00000001::operator()(&local_45);
    }
    bVar1 = true;
LAB_001e23d0:
    local_44 = 1;
    MutexLock::~MutexLock((MutexLock *)&p);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool CordzHandle::DiagnosticsHandleIsSafeToInspect(
    const CordzHandle* handle) const {
  if (!is_snapshot_) return false;
  if (handle == nullptr) return true;
  if (handle->is_snapshot_) return false;
  bool snapshot_found = false;
  Queue& global_queue = GlobalQueue();
  MutexLock lock(&global_queue.mutex);
  for (const CordzHandle* p = global_queue.dq_tail; p; p = p->dq_prev_) {
    if (p == handle) return !snapshot_found;
    if (p == this) snapshot_found = true;
  }
  ABSL_ASSERT(snapshot_found);  // Assert that 'this' is in delete queue.
  return true;
}